

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGen_X86.cpp
# Opt level: O3

void __thiscall CodeGenGenericContext::MemRead(CodeGenGenericContext *this,x86Argument *address)

{
  x86Reg xVar1;
  uint uVar2;
  int iVar3;
  x86Reg xVar4;
  uint uVar5;
  x86Reg xVar6;
  uint uVar7;
  long lVar8;
  
  xVar1 = address->ptrIndex;
  uVar2 = address->ptrNum;
  lVar8 = 0;
  do {
    if ((*(int *)((long)&this->memCache[0].address.type + lVar8) != 0) &&
       (address->ptrBase != rR14 || xVar1 != rNONE)) {
      iVar3 = *(int *)((long)&this->memCache[0].address.ptrIndex + lVar8);
      if (address->ptrBase == rEBX && xVar1 == rNONE) {
        if ((iVar3 == 0) && (*(int *)((long)&this->memCache[0].address.ptrBase + lVar8) == 2)) {
          xVar4 = (address->field_1).reg;
          if (xVar4 == rNONE) {
            __assert_fail("address.ptrSize != sNONE",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/CodeGen_X86.cpp"
                          ,0x40,"void CodeGenGenericContext::MemRead(const x86Argument &)");
          }
          uVar5 = *(uint *)((long)&this->memCache[0].address.field_1 + lVar8);
          if (uVar5 == 0) {
            __assert_fail("write.ptrSize != sNONE",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/CodeGen_X86.cpp"
                          ,0x41,"void CodeGenGenericContext::MemRead(const x86Argument &)");
          }
          xVar6 = (uint)(xVar4 != rECX) * 4 + rEDX;
          if (xVar4 < rECX) {
            xVar6 = xVar4;
          }
          uVar7 = (uint)(uVar5 != 3) * 4 + 4;
          if (uVar5 < 3) {
            uVar7 = uVar5;
          }
          uVar5 = *(uint *)((long)&this->memCache[0].address.ptrNum + lVar8);
          if ((uVar5 < xVar6 + uVar2) && (uVar2 < uVar5 + uVar7)) goto LAB_002a3dc8;
        }
      }
      else if ((iVar3 != 0) || (*(int *)((long)&this->memCache[0].address.ptrBase + lVar8) != 2)) {
LAB_002a3dc8:
        (&this->memCache[0].read)[lVar8] = true;
      }
    }
    lVar8 = lVar8 + 0x48;
    if (lVar8 == 0x480) {
      return;
    }
  } while( true );
}

Assistant:

void CodeGenGenericContext::MemRead(const x86Argument &address)
{
	(void)address;

	for(unsigned i = 0; i < memoryStateSize; i++)
	{
		MemCache &entry = memCache[i];

		x86Argument &write = entry.address;

		if(entry.address.type == x86Argument::argNone)
			continue;

		// Reading a constant can't mark any memory write entries as used, since they can't write there
		if(address.ptrIndex == rNONE && address.ptrBase == rR14)
			continue;

		// Reading from register file can't mark any memory writes with addresses from other registers since they can't point to it
		if(address.ptrIndex == rNONE && address.ptrBase == rEBX && (write.ptrIndex != rNONE || write.ptrBase != rEBX))
			continue;

		// Reading from an address in a register different from register file can't mark writes to register file as read
		if((address.ptrIndex != rNONE || address.ptrBase != rEBX) && write.ptrIndex == rNONE && write.ptrBase == rEBX)
			continue;

		// When reading and writing from register file, check read range intersection with write range
		if(address.ptrIndex == rNONE && address.ptrBase == rEBX && write.ptrIndex == rNONE && write.ptrBase == rEBX)
		{
			assert(address.ptrSize != sNONE);
			assert(write.ptrSize != sNONE);

			unsigned readSize = address.ptrSize == sBYTE ? 1 : (address.ptrSize == sWORD ? 2 : (address.ptrSize == sDWORD ? 4 : 8));
			unsigned writeSize = write.ptrSize == sBYTE ? 1 : (write.ptrSize == sWORD ? 2 : (write.ptrSize == sDWORD ? 4 : 8));

			if(unsigned(address.ptrNum) + readSize <= unsigned(write.ptrNum) || unsigned(address.ptrNum) >= unsigned(write.ptrNum) + writeSize)
				continue;
		}

		entry.read = true;
	}
}